

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_base.c
# Opt level: O0

void apx_connectionBase_destroy(apx_connectionBase_t *self)

{
  apx_connectionBase_t *self_local;
  
  if (self != (apx_connectionBase_t *)0x0) {
    apx_fileManager_destroy(&self->file_manager);
    apx_eventLoop_destroy(&self->event_loop);
    pthread_mutex_destroy((pthread_mutex_t *)&self->event_listener_mutex);
    adt_list_destroy(&self->connection_event_listeners);
    apx_allocator_stop(&self->allocator);
    apx_allocator_destroy(&self->allocator);
  }
  return;
}

Assistant:

void apx_connectionBase_destroy(apx_connectionBase_t *self)
{
   if (self != NULL)
   {
      apx_fileManager_destroy(&self->file_manager);
      apx_eventLoop_destroy(&self->event_loop);
      MUTEX_DESTROY(self->event_listener_mutex);
      adt_list_destroy(&self->connection_event_listeners);
      apx_allocator_stop(&self->allocator);
      apx_allocator_destroy(&self->allocator);
   }
}